

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaDup.c
# Opt level: O2

Gia_Man_t * Gia_ManDupFlip(Gia_Man_t *p,int *pInitState)

{
  int iVar1;
  int iLit1;
  uint uVar2;
  Gia_Man_t *p_00;
  char *pcVar3;
  Gia_Obj_t *pObj;
  ulong uVar4;
  uint uVar5;
  int v;
  
  p_00 = Gia_ManStart(p->nObjs);
  pcVar3 = Abc_UtilStrsav(p->pName);
  p_00->pName = pcVar3;
  pcVar3 = Abc_UtilStrsav(p->pSpec);
  p_00->pSpec = pcVar3;
  p->pObjs->Value = 0;
  for (v = 1; v < p->nObjs; v = v + 1) {
    pObj = Gia_ManObj(p,v);
    if (pObj == (Gia_Obj_t *)0x0) break;
    uVar2 = (uint)*(ulong *)pObj;
    uVar4 = *(ulong *)pObj & 0x1fffffff;
    if (uVar4 == 0x1fffffff || (int)uVar2 < 0) {
      if ((~uVar2 & 0x9fffffff) == 0) {
        uVar2 = Gia_ManAppendCi(p_00);
        pObj->Value = uVar2;
        iVar1 = Gia_ObjCioId(pObj);
        if (p->vCis->nSize - p->nRegs <= iVar1) {
          uVar2 = pObj->Value;
          iVar1 = Gia_ObjCioId(pObj);
          uVar5 = (p->nRegs - p->vCis->nSize) + iVar1;
          uVar2 = Abc_LitNotCond(uVar2,(uint)(((uint)pInitState[(int)uVar5 >> 5] >> (uVar5 & 0x1f) &
                                              1) != 0));
          goto LAB_001d37ac;
        }
      }
      else if ((int)uVar2 < 0 && (int)uVar4 != 0x1fffffff) {
        uVar2 = Gia_ObjFanin0Copy(pObj);
        pObj->Value = uVar2;
        iVar1 = Gia_ObjCioId(pObj);
        uVar2 = pObj->Value;
        if (p->vCos->nSize - p->nRegs <= iVar1) {
          iVar1 = Gia_ObjCioId(pObj);
          uVar5 = (p->nRegs - p->vCos->nSize) + iVar1;
          uVar2 = Abc_LitNotCond(uVar2,(uint)(((uint)pInitState[(int)uVar5 >> 5] >> (uVar5 & 0x1f) &
                                              1) != 0));
          pObj->Value = uVar2;
        }
        uVar2 = Gia_ManAppendCo(p_00,uVar2);
        goto LAB_001d37ac;
      }
    }
    else {
      iVar1 = Gia_ObjFanin0Copy(pObj);
      iLit1 = Gia_ObjFanin1Copy(pObj);
      uVar2 = Gia_ManAppendAnd(p_00,iVar1,iLit1);
LAB_001d37ac:
      pObj->Value = uVar2;
    }
  }
  Gia_ManSetRegNum(p_00,p->nRegs);
  return p_00;
}

Assistant:

Gia_Man_t * Gia_ManDupFlip( Gia_Man_t * p, int * pInitState )
{
    Gia_Man_t * pNew;
    Gia_Obj_t * pObj;
    int i;
    pNew = Gia_ManStart( Gia_ManObjNum(p) );
    pNew->pName = Abc_UtilStrsav( p->pName );
    pNew->pSpec = Abc_UtilStrsav( p->pSpec );
    Gia_ManConst0(p)->Value = 0;
    Gia_ManForEachObj1( p, pObj, i )
    {
        if ( Gia_ObjIsAnd(pObj) )
            pObj->Value = Gia_ManAppendAnd( pNew, Gia_ObjFanin0Copy(pObj), Gia_ObjFanin1Copy(pObj) );
        else if ( Gia_ObjIsCi(pObj) )
        {
            pObj->Value = Gia_ManAppendCi( pNew );
            if ( Gia_ObjCioId(pObj) >= Gia_ManPiNum(p) )
                pObj->Value = Abc_LitNotCond( pObj->Value, Abc_InfoHasBit((unsigned *)pInitState, Gia_ObjCioId(pObj) - Gia_ManPiNum(p)) );
        }
        else if ( Gia_ObjIsCo(pObj) )
        {
            pObj->Value = Gia_ObjFanin0Copy(pObj);
            if ( Gia_ObjCioId(pObj) >= Gia_ManPoNum(p) )
                pObj->Value = Abc_LitNotCond( pObj->Value, Abc_InfoHasBit((unsigned *)pInitState, Gia_ObjCioId(pObj) - Gia_ManPoNum(p)) );
            pObj->Value = Gia_ManAppendCo( pNew, pObj->Value );
        }
    }
    Gia_ManSetRegNum( pNew, Gia_ManRegNum(p) );
    return pNew;
}